

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

int __thiscall
vkb::PhysicalDeviceSelector::select
          (PhysicalDeviceSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *pvVar1;
  const_reference value;
  undefined4 in_register_00000034;
  error_code eVar2;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> local_30;
  
  select_impl(&local_30,(PhysicalDeviceSelector *)CONCAT44(in_register_00000034,__nfds));
  if (local_30.m_init == false) {
    eVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::error
                      (&local_30);
    *(int *)&(this->instance_info).instance = eVar2._M_value;
    (this->instance_info).surface = (VkSurfaceKHR)eVar2._M_cat;
  }
  else {
    pvVar1 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::value
                       (&local_30);
    if ((pvVar1->super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (pvVar1->super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::
               value(&local_30);
      value = std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::at(pvVar1,0);
      Result<vkb::PhysicalDevice>::Result((Result<vkb::PhysicalDevice> *)this,value);
      goto LAB_00107e96;
    }
    *(undefined4 *)&(this->instance_info).instance = 3;
    (this->instance_info).surface = (VkSurfaceKHR)&detail::physical_device_error_category;
  }
  (this->instance_info).version = 0;
  *(undefined1 *)&this[2].criteria.required_features2.features.sparseResidencyImage2D = 0;
LAB_00107e96:
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::destroy
            (&local_30);
  return (int)this;
}

Assistant:

Result<PhysicalDevice> PhysicalDeviceSelector::select() const {
    auto const selected_devices = select_impl();

    if (!selected_devices) return Result<PhysicalDevice>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<PhysicalDevice>{ PhysicalDeviceError::no_suitable_device };
    }

    return selected_devices.value().at(0);
}